

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

bool __thiscall
Js::ScriptContext::IsInNewFunctionMap
          (ScriptContext *this,EvalMapString *key,FunctionInfo **ppFuncInfo)

{
  Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *pCVar1;
  bool bVar2;
  
  pCVar1 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).newFunctionCache.ptr;
  if ((pCVar1 != (Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
                  *)0x0) &&
     (bVar2 = JsUtil::
              BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<Js::EvalMapStringInternal<false>>
                        ((BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(pCVar1->cacheStore).ptr,key,ppFuncInfo), bVar2)) {
    JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::Add
              ((((((this->super_ScriptContextBase).javascriptLibrary)->cache).newFunctionCache.ptr)
               ->cachePolicyType).store.ptr,key);
    return true;
  }
  return false;
}

Assistant:

bool ScriptContext::IsInNewFunctionMap(EvalMapString const& key, FunctionInfo **ppFuncInfo)
    {
        if (this->Cache()->newFunctionCache == nullptr)
        {
            return false;
        }

        // If eval map cleanup is false, to preserve existing behavior, add it to the eval map MRU list
        bool success = this->Cache()->newFunctionCache->TryGetValue(key, ppFuncInfo);
        if (success)
        {
            this->Cache()->newFunctionCache->NotifyAdd(key);
#ifdef VERBOSE_EVAL_MAP
#if DBG
            this->Cache()->newFunctionCache->DumpKeepAlives();
#endif
#endif
        }

        return success;
    }